

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O0

void __thiscall btVoronoiSimplexSolver::reset(btVoronoiSimplexSolver *this)

{
  btSubSimplexClosestResult *in_RDI;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btVector3 local_18;
  
  *(undefined1 *)(in_RDI[7].m_barycentricCoords + 3) = 0;
  (in_RDI->m_closestPointOnSimplex).m_floats[0] = 0.0;
  in_RDI[8].m_degenerate = true;
  local_1c = 1e+18;
  local_20 = 1e+18;
  local_24 = 1e+18;
  btVector3::btVector3(&local_18,&local_1c,&local_20,&local_24);
  *(undefined8 *)(in_RDI[7].m_closestPointOnSimplex.m_floats + 3) = local_18.m_floats._0_8_;
  *(undefined8 *)in_RDI[7].m_barycentricCoords = local_18.m_floats._8_8_;
  btSubSimplexClosestResult::reset(in_RDI);
  return;
}

Assistant:

void btVoronoiSimplexSolver::reset()
{
	m_cachedValidClosest = false;
	m_numVertices = 0;
	m_needsUpdate = true;
	m_lastW = btVector3(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
	m_cachedBC.reset();
}